

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_paramSwitch_e ZVar1;
  size_t sVar2;
  ZSTD_CCtx_params *in_RDI;
  
  if (in_RDI == (ZSTD_CCtx_params *)0x0) {
    uRam0000000000000004 = cParams._0_8_;
    uRam0000000000000018 = cParams._20_8_;
    uRam000000000000000c = cParams.hashLog;
    uRam0000000000000010 = cParams.searchLog;
    uRam0000000000000014 = cParams.minMatch;
    if (_DAT_00000060 == 0) goto LAB_001761c1;
    if (_DAT_00000060 != 1) goto LAB_00176223;
  }
  else {
    memset(in_RDI,0,0xd0);
    in_RDI->compressionLevel = 3;
    (in_RDI->fParams).contentSizeFlag = 1;
    (in_RDI->cParams).windowLog = cParams.windowLog;
    (in_RDI->cParams).chainLog = cParams.chainLog;
    (in_RDI->cParams).hashLog = cParams.hashLog;
    (in_RDI->cParams).searchLog = cParams.searchLog;
    (in_RDI->cParams).searchLog = cParams.searchLog;
    (in_RDI->cParams).minMatch = cParams.minMatch;
    (in_RDI->cParams).targetLength = cParams.targetLength;
    (in_RDI->cParams).strategy = cParams.strategy;
LAB_001761c1:
    if ((cParams.strategy < ZSTD_btopt) || (cParams.windowLog < 0x1b)) {
      (in_RDI->ldmParams).enableLdm = ZSTD_ps_disable;
      goto LAB_00176223;
    }
    (in_RDI->ldmParams).enableLdm = ZSTD_ps_enable;
  }
  ZSTD_ldm_adjustParameters(&in_RDI->ldmParams,&cParams);
  if ((in_RDI->ldmParams).hashLog < (in_RDI->ldmParams).bucketSizeLog) {
    __assert_fail("cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x51fa,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
  if (0x1f < (in_RDI->ldmParams).hashRateLog) {
    __assert_fail("cctxParams.ldmParams.hashRateLog < 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x51fb,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
LAB_00176223:
  ZVar1 = in_RDI->useBlockSplitter;
  if (ZVar1 == ZSTD_ps_auto) {
    if (cParams.strategy < ZSTD_btopt) {
      ZVar1 = ZSTD_ps_disable;
    }
    else {
      ZVar1 = (cParams.windowLog < 0x11) + ZSTD_ps_enable;
    }
  }
  in_RDI->useBlockSplitter = ZVar1;
  ZVar1 = ZSTD_resolveRowMatchFinderMode(in_RDI->useRowMatchFinder,&cParams);
  in_RDI->useRowMatchFinder = ZVar1;
  sVar2 = 0x20000;
  if (in_RDI->maxBlockSize != 0) {
    sVar2 = in_RDI->maxBlockSize;
  }
  in_RDI->maxBlockSize = sVar2;
  ZVar1 = (in_RDI->compressionLevel < 10) + ZSTD_ps_enable;
  if (in_RDI->searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar1 = in_RDI->searchForExternalRepcodes;
  }
  in_RDI->searchForExternalRepcodes = ZVar1;
  cParams_00.chainLog = cParams.chainLog;
  cParams_00.windowLog = cParams.windowLog;
  cParams_00.strategy = cParams.strategy;
  cParams_00.targetLength = cParams.targetLength;
  cParams_00.hashLog = cParams.hashLog;
  cParams_00.searchLog = cParams.searchLog;
  cParams_00.minMatch = cParams.minMatch;
  sVar2 = ZSTD_checkCParams(cParams_00);
  if (sVar2 == 0) {
    return in_RDI;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5203,
                "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}